

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_entry_strmode.c
# Opt level: O0

void test_entry_strmode(void)

{
  archive_entry *entry_00;
  archive_entry *unaff_retaddr;
  char *in_stack_00000008;
  archive_entry *entry;
  char *in_stack_00000018;
  void *in_stack_00000030;
  wchar_t in_stack_00000038;
  void *in_stack_ffffffffffffffe8;
  char *pcVar1;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  wchar_t id;
  wchar_t in_stack_fffffffffffffff4;
  
  entry_00 = archive_entry_new();
  assertion_assert((char *)unaff_retaddr,(wchar_t)((ulong)entry_00 >> 0x20),(wchar_t)entry_00,
                   (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   in_stack_ffffffffffffffe8);
  archive_entry_set_mode(entry_00,0x81a2);
  archive_entry_strmode((archive_entry_conflict *)unaff_retaddr);
  pcVar1 = (char *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (in_stack_00000018,entry._4_4_,in_stack_00000008,(char *)unaff_retaddr,(char *)entry_00,
             (char *)((ulong)(uint)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
             in_stack_00000038);
  archive_entry_set_mode(entry_00,0x81a4);
  archive_entry_set_hardlink((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,uVar2),pcVar1);
  archive_entry_strmode((archive_entry_conflict *)unaff_retaddr);
  pcVar1 = (char *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (in_stack_00000018,entry._4_4_,in_stack_00000008,(char *)unaff_retaddr,(char *)entry_00,
             (char *)((ulong)(uint)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
             in_stack_00000038);
  archive_entry_set_mode(entry_00,0x1a0);
  archive_entry_set_hardlink((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,uVar2),pcVar1);
  archive_entry_strmode((archive_entry_conflict *)unaff_retaddr);
  pcVar1 = (char *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (in_stack_00000018,entry._4_4_,in_stack_00000008,(char *)unaff_retaddr,(char *)entry_00,
             (char *)((ulong)(uint)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
             in_stack_00000038);
  archive_entry_set_hardlink((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,uVar2),pcVar1);
  archive_entry_set_mode(entry_00,0x41ff);
  archive_entry_strmode((archive_entry_conflict *)unaff_retaddr);
  assertion_equal_string
            (in_stack_00000018,entry._4_4_,in_stack_00000008,(char *)unaff_retaddr,(char *)entry_00,
             (char *)((ulong)(uint)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
             in_stack_00000038);
  archive_entry_set_mode(entry_00,0x67a2);
  archive_entry_strmode((archive_entry_conflict *)unaff_retaddr);
  assertion_equal_string
            (in_stack_00000018,entry._4_4_,in_stack_00000008,(char *)unaff_retaddr,(char *)entry_00,
             (char *)((ulong)(uint)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
             in_stack_00000038);
  archive_entry_set_mode(entry_00,0x2bff);
  archive_entry_strmode((archive_entry_conflict *)unaff_retaddr);
  assertion_equal_string
            (in_stack_00000018,entry._4_4_,in_stack_00000008,(char *)unaff_retaddr,(char *)entry_00,
             (char *)((ulong)(uint)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
             in_stack_00000038);
  archive_entry_set_mode(entry_00,0xc092);
  archive_entry_strmode((archive_entry_conflict *)unaff_retaddr);
  assertion_equal_string
            (in_stack_00000018,entry._4_4_,in_stack_00000008,(char *)unaff_retaddr,(char *)entry_00,
             (char *)((ulong)(uint)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
             in_stack_00000038);
  archive_entry_set_mode(entry_00,0x1124);
  archive_entry_strmode((archive_entry_conflict *)unaff_retaddr);
  assertion_equal_string
            (in_stack_00000018,entry._4_4_,in_stack_00000008,(char *)unaff_retaddr,(char *)entry_00,
             (char *)((ulong)(uint)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
             in_stack_00000038);
  archive_entry_set_mode(entry_00,0xa800);
  archive_entry_strmode((archive_entry_conflict *)unaff_retaddr);
  pcVar1 = (char *)0x0;
  id = L'\0';
  assertion_equal_string
            (in_stack_00000018,entry._4_4_,in_stack_00000008,(char *)unaff_retaddr,(char *)entry_00,
             (char *)((ulong)(uint)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
             in_stack_00000038);
  archive_entry_acl_add_entry
            (unaff_retaddr,(wchar_t)((ulong)entry_00 >> 0x20),(wchar_t)entry_00,
             in_stack_fffffffffffffff4,id,pcVar1);
  archive_entry_strmode((archive_entry_conflict *)unaff_retaddr);
  assertion_equal_string
            (in_stack_00000018,entry._4_4_,in_stack_00000008,(char *)unaff_retaddr,(char *)entry_00,
             (char *)((ulong)(uint)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,
             in_stack_00000038);
  archive_entry_free((archive_entry *)0x14fe14);
  return;
}

Assistant:

DEFINE_TEST(test_entry_strmode)
{
	struct archive_entry *entry;

	assert((entry = archive_entry_new()) != NULL);

	archive_entry_set_mode(entry, AE_IFREG | 0642);
	assertEqualString(archive_entry_strmode(entry), "-rw-r---w- ");

	/* Regular file + hardlink still shows as regular file. */
	archive_entry_set_mode(entry, AE_IFREG | 0644);
	archive_entry_set_hardlink(entry, "link");
	assertEqualString(archive_entry_strmode(entry), "-rw-r--r-- ");

	archive_entry_set_mode(entry, 0640);
	archive_entry_set_hardlink(entry, "link");
	assertEqualString(archive_entry_strmode(entry), "hrw-r----- ");
	archive_entry_set_hardlink(entry, NULL);

	archive_entry_set_mode(entry, AE_IFDIR | 0777);
	assertEqualString(archive_entry_strmode(entry), "drwxrwxrwx ");

	archive_entry_set_mode(entry, AE_IFBLK | 03642);
	assertEqualString(archive_entry_strmode(entry), "brw-r-S-wT ");

	archive_entry_set_mode(entry, AE_IFCHR | 05777);
	assertEqualString(archive_entry_strmode(entry), "crwsrwxrwt ");

	archive_entry_set_mode(entry, AE_IFSOCK | 0222);
	assertEqualString(archive_entry_strmode(entry), "s-w--w--w- ");

	archive_entry_set_mode(entry, AE_IFIFO | 0444);
	assertEqualString(archive_entry_strmode(entry), "pr--r--r-- ");

	archive_entry_set_mode(entry, AE_IFLNK | 04000);
	assertEqualString(archive_entry_strmode(entry), "l--S------ ");

	archive_entry_acl_add_entry(entry, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
	    0007, ARCHIVE_ENTRY_ACL_GROUP, 78, "group78");
	assertEqualString(archive_entry_strmode(entry), "l--S------+");

	/* Release the experimental entry. */
	archive_entry_free(entry);
}